

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticVersion.cpp
# Opt level: O1

string * __thiscall
beast::SemanticVersion::print_abi_cxx11_(string *__return_storage_ptr__,SemanticVersion *this)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  uint uVar4;
  string *this_00;
  uint uVar5;
  long *plVar6;
  undefined8 *puVar7;
  uint uVar8;
  ulong *puVar9;
  ulong uVar10;
  uint uVar11;
  string __str_1;
  string __str_2;
  string __str;
  string local_120;
  ulong *local_100;
  long local_f8;
  ulong local_f0 [2];
  ulong *local_e0;
  long local_d8;
  ulong local_d0;
  long lStack_c8;
  long *local_c0;
  undefined8 local_b8;
  long local_b0;
  undefined8 uStack_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  string *local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_a0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_a0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = this->majorVersion;
  uVar4 = -uVar3;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  uVar11 = 1;
  if (9 < uVar4) {
    uVar10 = (ulong)uVar4;
    uVar5 = 4;
    do {
      uVar11 = uVar5;
      uVar8 = (uint)uVar10;
      if (uVar8 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_001c0edd;
      }
      if (uVar8 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_001c0edd;
      }
      if (uVar8 < 10000) goto LAB_001c0edd;
      uVar10 = uVar10 / 10000;
      uVar5 = uVar11 + 4;
    } while (99999 < uVar8);
    uVar11 = uVar11 + 1;
  }
LAB_001c0edd:
  local_50[0] = local_40;
  local_98 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar11 - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_50[0]),uVar11,uVar4);
  plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_d0 = *puVar9;
    lStack_c8 = plVar6[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *puVar9;
    local_e0 = (ulong *)*plVar6;
  }
  local_d8 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar3 = this->minorVersion;
  uVar4 = -uVar3;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  uVar11 = 1;
  if (9 < uVar4) {
    uVar10 = (ulong)uVar4;
    uVar5 = 4;
    do {
      uVar11 = uVar5;
      uVar8 = (uint)uVar10;
      if (uVar8 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_001c0fd3;
      }
      if (uVar8 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_001c0fd3;
      }
      if (uVar8 < 10000) goto LAB_001c0fd3;
      uVar10 = uVar10 / 10000;
      uVar5 = uVar11 + 4;
    } while (99999 < uVar8);
    uVar11 = uVar11 + 1;
  }
LAB_001c0fd3:
  local_100 = local_f0;
  std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar11 - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_100),uVar11,uVar4);
  uVar10 = 0xf;
  if (local_e0 != &local_d0) {
    uVar10 = local_d0;
  }
  if (uVar10 < (ulong)(local_f8 + local_d8)) {
    uVar10 = 0xf;
    if (local_100 != local_f0) {
      uVar10 = local_f0[0];
    }
    if (uVar10 < (ulong)(local_f8 + local_d8)) goto LAB_001c1047;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_e0);
  }
  else {
LAB_001c1047:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_100);
  }
  local_c0 = &local_b0;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_b0 = *plVar6;
    uStack_a8 = puVar7[3];
  }
  else {
    local_b0 = *plVar6;
    local_c0 = (long *)*puVar7;
  }
  local_b8 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_60 = *puVar9;
    lStack_58 = plVar6[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar9;
    local_70 = (ulong *)*plVar6;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar3 = this->patchVersion;
  uVar4 = -uVar3;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  uVar11 = 1;
  if (9 < uVar4) {
    uVar10 = (ulong)uVar4;
    uVar5 = 4;
    do {
      uVar11 = uVar5;
      uVar8 = (uint)uVar10;
      if (uVar8 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_001c1176;
      }
      if (uVar8 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_001c1176;
      }
      if (uVar8 < 10000) goto LAB_001c1176;
      uVar10 = uVar10 / 10000;
      uVar5 = uVar11 + 4;
    } while (99999 < uVar8);
    uVar11 = uVar11 + 1;
  }
LAB_001c1176:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar11 - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_90),uVar11,uVar4);
  this_00 = local_98;
  uVar10 = 0xf;
  if (local_70 != &local_60) {
    uVar10 = local_60;
  }
  if (uVar10 < (ulong)(local_88 + local_68)) {
    uVar10 = 0xf;
    if (local_90 != local_80) {
      uVar10 = local_80[0];
    }
    if ((ulong)(local_88 + local_68) <= uVar10) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
      goto LAB_001c1233;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
LAB_001c1233:
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  psVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_120.field_2._M_allocated_capacity = *psVar1;
    local_120.field_2._8_8_ = puVar7[3];
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar1;
    local_120._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_120._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_120);
  paVar2 = &local_120.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((this->preReleaseIdentifiers).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->preReleaseIdentifiers).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)this_00);
    print_identifiers(&local_120,&this->preReleaseIdentifiers);
    std::__cxx11::string::_M_append((char *)this_00,(ulong)local_120._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->metaData).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->metaData).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)this_00);
    print_identifiers(&local_120,&this->metaData);
    std::__cxx11::string::_M_append((char *)this_00,(ulong)local_120._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
  }
  return this_00;
}

Assistant:

std::string SemanticVersion::print () const
{
    std::string s;

    s = std::to_string (majorVersion) + "." +
        std::to_string (minorVersion) + "." +
        std::to_string (patchVersion);

    if (!preReleaseIdentifiers.empty ())
    {
        s += "-";
        s += print_identifiers (preReleaseIdentifiers);
    }

    if (!metaData.empty ())
    {
        s += "+";
        s += print_identifiers (metaData);
    }

    return s;
}